

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_1::AttachmentTextureCubeMapFaceCase::test
          (AttachmentTextureCubeMapFaceCase *this)

{
  int local_40;
  int local_3c;
  int ndx_1;
  int ndx;
  GLenum faces [6];
  GLuint local_18;
  GLuint local_14;
  GLuint textureID;
  GLuint framebufferID;
  AttachmentTextureCubeMapFaceCase *this_local;
  
  local_14 = 0;
  _textureID = this;
  glu::CallLogWrapper::glGenFramebuffers(&(this->super_ApiCase).super_CallLogWrapper,1,&local_14);
  glu::CallLogWrapper::glBindFramebuffer
            (&(this->super_ApiCase).super_CallLogWrapper,0x8d40,local_14);
  ApiCase::expectError(&this->super_ApiCase,0);
  local_18 = 0;
  glu::CallLogWrapper::glGenTextures(&(this->super_ApiCase).super_CallLogWrapper,1,&local_18);
  glu::CallLogWrapper::glBindTexture(&(this->super_ApiCase).super_CallLogWrapper,0x8513,local_18);
  ApiCase::expectError(&this->super_ApiCase,0);
  _ndx_1 = 0x851600008515;
  faces[0] = 0x8517;
  faces[1] = 0x8518;
  faces[2] = 0x8519;
  faces[3] = 0x851a;
  for (local_3c = 0; local_3c < 6; local_3c = local_3c + 1) {
    glu::CallLogWrapper::glTexImage2D
              (&(this->super_ApiCase).super_CallLogWrapper,(&ndx_1)[local_3c],0,0x1907,0x40,0x40,0,
               0x1907,0x1401,(void *)0x0);
  }
  ApiCase::expectError(&this->super_ApiCase,0);
  for (local_40 = 0; local_40 < 6; local_40 = local_40 + 1) {
    glu::CallLogWrapper::glFramebufferTexture2D
              (&(this->super_ApiCase).super_CallLogWrapper,0x8d40,0x8ce0,(&ndx_1)[local_40],local_18
               ,0);
    checkColorAttachmentParam
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               &(this->super_ApiCase).super_CallLogWrapper,0x8d40,0x8cd3,(&ndx_1)[local_40]);
  }
  glu::CallLogWrapper::glFramebufferTexture2D
            (&(this->super_ApiCase).super_CallLogWrapper,0x8d40,0x8ce0,0xde1,0,0);
  glu::CallLogWrapper::glDeleteTextures(&(this->super_ApiCase).super_CallLogWrapper,1,&local_18);
  glu::CallLogWrapper::glDeleteFramebuffers(&(this->super_ApiCase).super_CallLogWrapper,1,&local_14)
  ;
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		GLuint framebufferID = 0;
		glGenFramebuffers(1, &framebufferID);
		glBindFramebuffer(GL_FRAMEBUFFER, framebufferID);
		expectError(GL_NO_ERROR);

		{
			GLuint textureID = 0;
			glGenTextures(1, &textureID);
			glBindTexture(GL_TEXTURE_CUBE_MAP, textureID);
			expectError(GL_NO_ERROR);

			const GLenum faces[] =
			{
				GL_TEXTURE_CUBE_MAP_POSITIVE_X, GL_TEXTURE_CUBE_MAP_NEGATIVE_X,
				GL_TEXTURE_CUBE_MAP_POSITIVE_Y, GL_TEXTURE_CUBE_MAP_NEGATIVE_Y,
				GL_TEXTURE_CUBE_MAP_POSITIVE_Z, GL_TEXTURE_CUBE_MAP_NEGATIVE_Z
			};

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(faces); ++ndx)
				glTexImage2D(faces[ndx], 0, GL_RGB, 64, 64, 0, GL_RGB, GL_UNSIGNED_BYTE, DE_NULL);
			expectError(GL_NO_ERROR);

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(faces); ++ndx)
			{
				glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, faces[ndx], textureID, 0);
				checkColorAttachmentParam(m_testCtx, *this, GL_FRAMEBUFFER, GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_CUBE_MAP_FACE, faces[ndx]);
			}

			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, 0, 0);
			glDeleteTextures(1, &textureID);
		}

		glDeleteFramebuffers(1, &framebufferID);
		expectError(GL_NO_ERROR);
	}